

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ccnr.cc
# Opt level: O3

uint __thiscall CCNR::Mersenne::next32(Mersenne *this)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  
  iVar1 = this->mti;
  if (0x26f < iVar1) {
    uVar2 = this->mt[0];
    lVar3 = 0;
    do {
      uVar4 = uVar2 & 0x80000000;
      uVar2 = this->mt[lVar3 + 1];
      this->mt[lVar3] =
           next32::mag01[uVar2 & 1] ^ this->mt[lVar3 + 0x18d] ^ (uVar2 & 0x7ffffffe | uVar4) >> 1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0xe3);
    uVar2 = this->mt[0xe3];
    lVar3 = 0xe4;
    do {
      uVar4 = uVar2 & 0x80000000;
      uVar2 = this->mt[lVar3];
      this->mt[lVar3 + -1] =
           next32::mag01[uVar2 & 1] ^ *(uint *)((long)this + lVar3 * 4 + -0x390) ^
           (uVar2 & 0x7ffffffe | uVar4) >> 1;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 0x270);
    this->mt[0x26f] =
         next32::mag01[this->mt[0] & 1] ^ this->mt[0x18c] ^
         (this->mt[0] & 0x7ffffffe | this->mt[0x26f] & 0x80000000) >> 1;
    iVar1 = 0;
  }
  this->mti = iVar1 + 1;
  uVar2 = this->mt[iVar1] >> 0xb ^ this->mt[iVar1];
  uVar2 = (uVar2 & 0x13a58ad) << 7 ^ uVar2;
  uVar2 = (uVar2 & 0x1df8c) << 0xf ^ uVar2;
  return uVar2 >> 0x12 ^ uVar2;
}

Assistant:

unsigned int Mersenne::next32()
{
    unsigned int y;
    static unsigned int mag01[2] = { 0x0UL, MATRIX_A };
    if (mti >= N) {
        int kk;
        for (kk = 0; kk < N - M; kk++) {
            y = (mt[kk] & UPPER_MASK) | (mt[kk + 1] & LOWER_MASK);
            mt[kk] = mt[kk + M] ^ (y >> 1) ^ mag01[y & 0x1UL];
        }
        for (; kk < N - 1; kk++) {
            y = (mt[kk] & UPPER_MASK) | (mt[kk + 1] & LOWER_MASK);
            mt[kk] = mt[kk + (M - N)] ^ (y >> 1) ^ mag01[y & 0x1UL];
        }
        y = (mt[N - 1] & UPPER_MASK) | (mt[0] & LOWER_MASK);
        mt[N - 1] = mt[M - 1] ^ (y >> 1) ^ mag01[y & 0x1UL];
        mti = 0;
    }
    y = mt[mti++];
    y ^= (y >> 11);
    y ^= (y << 7) & 0x9d2c5680UL;
    y ^= (y << 15) & 0xefc60000UL;
    y ^= (y >> 18);
    return y;
}